

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void var_filter_block2d_bil_second_pass_c
               (uint16_t *a,uint8_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  uint j;
  uint i;
  uint output_width_local;
  uint output_height_local;
  uint pixel_step_local;
  uint src_pixels_per_line_local;
  uint8_t *b_local;
  uint16_t *a_local;
  
  b_local = b;
  a_local = a;
  for (i = 0; i < output_height; i = i + 1) {
    for (j = 0; j < output_width; j = j + 1) {
      b_local[j] = (uint8_t)((int)((uint)*a_local * (uint)*filter +
                                   (uint)a_local[pixel_step] * (uint)filter[1] + 0x40) >> 7);
      a_local = a_local + 1;
    }
    a_local = a_local + (src_pixels_per_line - output_width);
    b_local = b_local + output_width;
  }
  return;
}

Assistant:

static void var_filter_block2d_bil_second_pass_c(
    const uint16_t *a, uint8_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; ++j) {
      b[j] = ROUND_POWER_OF_TWO(
          (int)a[0] * filter[0] + (int)a[pixel_step] * filter[1], FILTER_BITS);
      ++a;
    }

    a += src_pixels_per_line - output_width;
    b += output_width;
  }
}